

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

QPDFObjectHandle QPDFObjectHandle::newOperator(string *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  _Alloc_hider local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  QPDFObject::create<QPDF_Operator,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe8);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (value->_M_dataplus)._M_p = local_18._M_p;
  value->_M_string_length = (size_type)_Var1._M_pi;
  local_18._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)value;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newOperator(std::string const& value)
{
    return {QPDFObject::create<QPDF_Operator>(value)};
}